

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::CheckerDeclarationSyntax::CheckerDeclarationSyntax
          (CheckerDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token keyword,Token name,
          AssertionItemPortListSyntax *portList,Token semi,
          SyntaxList<slang::syntax::MemberSyntax> *members,Token end,
          NamedBlockClauseSyntax *endBlockName)

{
  bool bVar1;
  reference ppMVar2;
  SyntaxNode *in_RCX;
  SyntaxNode *in_RDX;
  MemberSyntax *in_RSI;
  SyntaxNode *in_RDI;
  undefined8 in_R8;
  SyntaxNode *in_R9;
  SyntaxNode *in_stack_00000008;
  MemberSyntax *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::MemberSyntax> *__range2;
  SyntaxList<slang::syntax::MemberSyntax> *this_00;
  SyntaxList<slang::syntax::MemberSyntax> *this_01;
  __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
  in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  
  this_01 = (SyntaxList<slang::syntax::MemberSyntax> *)&__begin2;
  this_00 = (SyntaxList<slang::syntax::MemberSyntax> *)&stack0x00000010;
  MemberSyntax::MemberSyntax
            (in_RSI,(SyntaxKind)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
             in_stack_ffffffffffffffc0._M_current);
  in_RDI[3].parent = in_RDX;
  in_RDI[3].previewNode = in_RCX;
  *(undefined8 *)(in_RDI + 4) = in_R8;
  in_RDI[4].parent = in_R9;
  in_RDI[4].previewNode = in_stack_00000008;
  *(_func_int ***)(in_RDI + 5) = (this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[5].parent = *(SyntaxNode **)&(this_00->super_SyntaxListBase).super_SyntaxNode;
  SyntaxList<slang::syntax::MemberSyntax>::SyntaxList(this_01,this_00);
  *(_func_int ***)(in_RDI + 8) = (this_01->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[8].parent = *(SyntaxNode **)&(this_01->super_SyntaxListBase).super_SyntaxNode;
  in_RDI[8].previewNode = (SyntaxNode *)attributes;
  if (in_RDI[4].previewNode != (SyntaxNode *)0x0) {
    (in_RDI[4].previewNode)->parent = in_RDI;
  }
  in_RDI[6].parent = in_RDI;
  std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
            ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)this_00);
  std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end
            ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                        *)this_01,
                       (__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                        *)this_00);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppMVar2 = __gnu_cxx::
              __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
              ::operator*((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                           *)&stack0xffffffffffffffc0);
    ((*ppMVar2)->super_SyntaxNode).parent = in_RDI;
    __gnu_cxx::
    __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                  *)&stack0xffffffffffffffc0);
  }
  if (in_RDI[8].previewNode != (SyntaxNode *)0x0) {
    (in_RDI[8].previewNode)->parent = in_RDI;
  }
  return;
}

Assistant:

CheckerDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token keyword, Token name, AssertionItemPortListSyntax* portList, Token semi, const SyntaxList<MemberSyntax>& members, Token end, NamedBlockClauseSyntax* endBlockName) :
        MemberSyntax(SyntaxKind::CheckerDeclaration, attributes), keyword(keyword), name(name), portList(portList), semi(semi), members(members), end(end), endBlockName(endBlockName) {
        if (this->portList) this->portList->parent = this;
        this->members.parent = this;
        for (auto child : this->members)
            child->parent = this;
        if (this->endBlockName) this->endBlockName->parent = this;
    }